

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O3

char * Nm_ManStoreIdName(Nm_Man_t *p,int ObjId,int Type,char *pName,char *pSuffix)

{
  int iVar1;
  Nm_Entry_t *pNVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  Nm_Entry_t *pEntry;
  
  pNVar2 = Nm_ManTableLookupId(p,ObjId);
  if (pNVar2 == (Nm_Entry_t *)0x0) {
    sVar3 = strlen(pName);
    if (pSuffix == (char *)0x0) {
      pSuffix = "";
      iVar1 = 0;
    }
    else {
      sVar4 = strlen(pSuffix);
      iVar1 = (int)sVar4;
    }
    uVar5 = ((ulong)(uint)((int)sVar3 + 0x20 + iVar1) << 0x20) + 0x100000000;
    pEntry = (Nm_Entry_t *)
             Extra_MmFlexEntryFetch
                       (p->pMem,(int)(uVar5 >> 0x20) + (uint)((uVar5 & 0x700000000) != 0) * 8 &
                                0xfffffff8);
    pEntry->pNextI2N = (Nm_Entry_t *)0x0;
    pEntry->pNextN2I = (Nm_Entry_t *)0x0;
    pEntry->pNameSake = (Nm_Entry_t *)0x0;
    pEntry->ObjId = ObjId;
    pEntry->Type = Type;
    pNVar2 = pEntry + 1;
    sprintf((char *)pNVar2,"%s%s",pName,pSuffix);
    iVar1 = Nm_ManTableAdd(p,pEntry);
    if (iVar1 != 1) {
      __assert_fail("RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/nm/nmApi.c"
                    ,0x85,"char *Nm_ManStoreIdName(Nm_Man_t *, int, int, char *, char *)");
    }
  }
  else {
    puts("Nm_ManStoreIdName(): Entry with the same ID already exists.");
    pNVar2 = (Nm_Entry_t *)0x0;
  }
  return (char *)pNVar2;
}

Assistant:

char * Nm_ManStoreIdName( Nm_Man_t * p, int ObjId, int Type, char * pName, char * pSuffix )
{
    Nm_Entry_t * pEntry;
    int RetValue, nEntrySize;
    // check if the object with this ID is already stored
    if ( (pEntry = Nm_ManTableLookupId(p, ObjId)) )
    {
        printf( "Nm_ManStoreIdName(): Entry with the same ID already exists.\n" );
        return NULL;
    }
    // create a new entry
    nEntrySize = sizeof(Nm_Entry_t) + strlen(pName) + (pSuffix?strlen(pSuffix):0) + 1;
//    nEntrySize = (nEntrySize / 4 + ((nEntrySize % 4) > 0)) * 4;
    nEntrySize = (nEntrySize / sizeof(char*) + ((nEntrySize % sizeof(char*)) > 0)) * sizeof(char*); // added by Saurabh on Sep 3, 2009
    pEntry = (Nm_Entry_t *)Extra_MmFlexEntryFetch( p->pMem, nEntrySize );
    pEntry->pNextI2N = pEntry->pNextN2I = pEntry->pNameSake = NULL;
    pEntry->ObjId = ObjId;
    pEntry->Type = Type;
    sprintf( pEntry->Name, "%s%s", pName, pSuffix? pSuffix : "" );
    // add the entry to the hash table
    RetValue = Nm_ManTableAdd( p, pEntry );
    assert( RetValue == 1 );
    return pEntry->Name;
}